

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_tvptr(ASMState *as,Reg dest,IRRef ref)

{
  uint rr;
  int32_t ofs;
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  ASMState *in_RDI;
  Reg src;
  IRIns *ir;
  RegSet in_stack_ffffffffffffffc8;
  Reg in_stack_ffffffffffffffcc;
  ASMState *in_stack_ffffffffffffffd0;
  int32_t in_stack_ffffffffffffffd8;
  Reg in_stack_ffffffffffffffdc;
  IRIns *as_00;
  
  as_00 = in_RDI->ir + in_EDX;
  if (((as_00->field_1).t.irt & 0x1f) == 0xe) {
    if (in_EDX < 0x8000) {
      emit_loadi((ASMState *)&as_00->field_0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    }
    else {
      rr = in_ESI | 0x80200;
      ofs = ra_spill(in_RDI,(IRIns *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      emit_rmro(in_RDI,XO_LEA,rr,4,ofs);
    }
  }
  else {
    if (in_EDX < 0x8000) {
      if (2 < ((as_00->field_1).t.irt & 0x1f)) {
        emit_movmroi(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0
                    );
      }
    }
    else {
      in_stack_ffffffffffffffdc =
           ra_alloc1(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      iVar1 = 0;
      if ((0x604208U >> ((as_00->field_1).t.irt & 0x1f) & 1) != 0) {
        iVar1 = 0x80200;
      }
      emit_rmro(in_RDI,XO_MOVto,in_stack_ffffffffffffffdc + iVar1,in_ESI,0);
    }
    if (((as_00->field_1).t.irt & 0x1f) != 3) {
      emit_movmroi(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0);
    }
    emit_loadi((ASMState *)&as_00->field_0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void asm_tvptr(ASMState *as, Reg dest, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (irt_isnum(ir->t)) {
    /* For numbers use the constant itself or a spill slot as a TValue. */
    if (irref_isk(ref))
      emit_loada(as, dest, ir_knum(ir));
    else
      emit_rmro(as, XO_LEA, dest|REX_64, RID_ESP, ra_spill(as, ir));
  } else {
    /* Otherwise use g->tmptv to hold the TValue. */
#if LJ_GC64
    if (irref_isk(ref)) {
      TValue k;
      lj_ir_kvalue(as->J->L, &k, ir);
      emit_movmroi(as, dest, 4, k.u32.hi);
      emit_movmroi(as, dest, 0, k.u32.lo);
    } else {
      /* TODO: 64 bit store + 32 bit load-modify-store is suboptimal. */
      Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
      if (irt_is64(ir->t)) {
	emit_u32(as, irt_toitype(ir->t) << 15);
	emit_rmro(as, XO_ARITHi, XOg_OR, dest, 4);
      } else {
	/* Currently, no caller passes integers that might end up here. */
	emit_movmroi(as, dest, 4, (irt_toitype(ir->t) << 15));
      }
      emit_movtomro(as, REX_64IR(ir, src), dest, 0);
    }
#else
    if (!irref_isk(ref)) {
      Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
      emit_movtomro(as, REX_64IR(ir, src), dest, 0);
    } else if (!irt_ispri(ir->t)) {
      emit_movmroi(as, dest, 0, ir->i);
    }
    if (!(LJ_64 && irt_islightud(ir->t)))
      emit_movmroi(as, dest, 4, irt_toitype(ir->t));
#endif
    emit_loada(as, dest, &J2G(as->J)->tmptv);
  }
}